

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock.c
# Opt level: O2

void rwlock_unlock_common(RWLock *rwlock,int keep_reading)

{
  atomic_int_fast32_t *paVar1;
  long lVar2;
  int_fast32_t i;
  ulong uVar3;
  
  LOCK();
  paVar1 = &rwlock->num_pending;
  lVar2 = *paVar1;
  *paVar1 = *paVar1 + (ulong)(keep_reading + 0x40000000);
  UNLOCK();
  uVar3 = (ulong)(uint)keep_reading;
  lVar2 = uVar3 + lVar2;
  for (; (long)uVar3 < lVar2 + 0x40000000; uVar3 = uVar3 + 1) {
    sem_post((sem_t *)&rwlock->reader_wait);
  }
  pthread_mutex_unlock((pthread_mutex_t *)rwlock);
  return;
}

Assistant:

static inline void
rwlock_unlock_common(RWLock *rwlock, int keep_reading)
{
	int_fast32_t r = atomic_fetch_add(&rwlock->num_pending,
			     MAX_READERS + keep_reading) +
	    MAX_READERS + keep_reading;
	for (int_fast32_t i = keep_reading; i < r; ++i) {
		(void)sem_post(&rwlock->reader_wait);
	}
	(void)pthread_mutex_unlock(&rwlock->mutex);
}